

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall gl3cts::TransformFeedback::DrawXFBStream::prepareObjects(DrawXFBStream *this)

{
  GLuint *pGVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  GLuint i;
  long lVar6;
  Functions *gl;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  GVar3 = Utilities::buildProgram
                    (gl,this->m_context->m_testCtx->m_log,s_geometry_shader,(GLchar *)0x0,
                     (GLchar *)0x0,s_vertex_shader_blank,s_fragment_shader,s_xfb_varyings,3,0x8c8c,
                     false,(GLint *)0x0);
  this->m_program_id_generate = GVar3;
  if (GVar3 != 0) {
    GVar3 = Utilities::buildProgram
                      (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,
                       (GLchar *)0x0,s_vertex_shader_pass,s_fragment_shader,(GLchar **)0x0,0,0x8c8c,
                       false,(GLint *)0x0);
    this->m_program_id_draw = GVar3;
    if (GVar3 != 0) {
      (*gl->genTransformFeedbacks)(1,&this->m_xfb_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenTransformFeedbacks call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x155e);
      (*gl->bindTransformFeedback)(0x8e22,this->m_xfb_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindTransformFeedbacks call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1561);
      (*gl->genVertexArrays)(1,&this->m_vao_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenVertexArrays call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1565);
      (*gl->bindVertexArray)(this->m_vao_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindVertexArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1568);
      pGVar1 = this->m_bo_id;
      (*gl->genBuffers)(2,pGVar1);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenBuffers call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x156c);
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        (*gl->bindBuffer)(0x8c8e,pGVar1[lVar6]);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glBindBuffer call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1571);
        (*gl->bufferData)(0x8c8e,0x30,(void *)0x0,0x88ea);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glBufferData call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1574);
        (*gl->bindBufferBase)(0x8c8e,(GLuint)lVar6,pGVar1[lVar6]);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glBindBufferRange call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x1577);
      }
      (*gl->genQueries)(4,this->m_qo_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenQueries call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x157c);
      (*gl->clearColor)(0.0,0.0,0.0,1.0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glClearColor call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1580);
      (*gl->genFramebuffers)(1,&this->m_fbo_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenFramebuffers call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1583);
      (*gl->genRenderbuffers)(1,&this->m_rbo_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenRenderbuffers call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1586);
      (*gl->bindFramebuffer)(0x8d40,this->m_fbo_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindFramebuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1589);
      (*gl->bindRenderbuffer)(0x8d41,this->m_rbo_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindRenderbuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x158c);
      (*gl->renderbufferStorage)(0x8d41,0x8229,2,2);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glRenderbufferStorage call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x158f);
      (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,this->m_rbo_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glFramebufferRenderbuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1592);
      GVar4 = (*gl->checkFramebufferStatus)(0x8d40);
      if (GVar4 == 0x8cd5) {
        (*gl->viewport)(0,0,2,2);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glViewport call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x159a);
        return;
      }
    }
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBStream::prepareObjects()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id_generate = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), s_geometry_shader, NULL, NULL, s_vertex_shader_blank,
		s_fragment_shader, s_xfb_varyings, s_xfb_varyings_count, GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id_generate)
	{
		throw 0;
	}

	m_program_id_draw = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_pass, s_fragment_shader, NULL, 0,
		GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id_draw)
	{
		throw 0;
	}

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(1, &m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedbacks call failed.");

	/* Create empty Vertex Array Object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Prepare buffer objects. */
	gl.genBuffers(s_bo_ids_count, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	for (glw::GLuint i = 0; i < s_bo_ids_count; ++i)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY); /* allocation */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, i, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange call failed.");
	}

	/* Generate queries */
	gl.genQueries(s_qo_ids_count, m_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");

	/* Prepare framebuffer. */
	gl.clearColor(0.f, 0.f, 0.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor call failed.");

	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.genRenderbuffers(1, &m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer call failed.");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R8, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage call failed.");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_view_size, s_view_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}